

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O2

double __thiscall
duckdb::VectorTryCastStrictOperator<duckdb::TryCast>::Operation<duckdb::string_t,double>
          (VectorTryCastStrictOperator<duckdb::TryCast> *this,string_t input,ValidityMask *mask,
          idx_t idx,void *dataptr)

{
  bool bVar1;
  double *result;
  double dVar2;
  string_t input_00;
  string_t input_01;
  double output;
  double local_58;
  string local_50;
  
  input_01.value._0_8_ = input.value._0_8_;
  result = (double *)(ulong)*(byte *)(*(long *)(idx + 8) + 8);
  input_01.value.pointer.ptr = (char *)&local_58;
  bVar1 = TryCast::Operation<duckdb::string_t,double>((TryCast *)this,input_01,result,SUB81(idx,0));
  if (!bVar1) {
    input_00.value.pointer.ptr = (char *)result;
    input_00.value._0_8_ = input_01.value._0_8_;
    CastExceptionText<duckdb::string_t,double>(&local_50,(duckdb *)this,input_00);
    dVar2 = HandleVectorCastError::Operation<double>
                      (&local_50,input.value._8_8_,(idx_t)mask,(VectorTryCastData *)idx);
    ::std::__cxx11::string::~string((string *)&local_50);
    local_58 = dVar2;
  }
  return local_58;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output, data->parameters.strict))) {
			return output;
		}
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}